

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

void __thiscall
QWidgetWindow::handleDragEnterEvent(QWidgetWindow *this,QDragMoveEvent *event,QWidget *widget)

{
  Data *pDVar1;
  ulong uVar2;
  Data *pDVar3;
  uint in_ECX;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  undefined8 *puVar7;
  QPoint *pQVar8;
  QObject *pQVar9;
  long in_FS_OFFSET;
  byte bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  QDragEnterEvent translated;
  QPoint mapped;
  QPoint local_98;
  undefined1 local_8c;
  QPoint local_48;
  QPoint local_40;
  long local_38;
  
  bVar10 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    auVar11._0_8_ =
         (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
         *(double *)(event + 0x10);
    auVar11._8_8_ =
         (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
         *(double *)(event + 0x18);
    auVar11 = minpd(_DAT_0066f5d0,auVar11);
    auVar12._8_8_ = -(ulong)(-2147483648.0 < auVar11._8_8_);
    auVar12._0_8_ = -(ulong)(-2147483648.0 < auVar11._0_8_);
    uVar2 = (ulong)(uint)(int)auVar11._0_8_;
    in_ECX = movmskpd(in_ECX,auVar12);
    uVar6 = (ulong)(uint)(int)auVar11._8_8_ << 0x20;
    if ((in_ECX & 2) == 0) {
      uVar6 = 0x8000000000000000;
    }
    if ((in_ECX & 1) == 0) {
      uVar2 = 0x80000000;
    }
    local_98 = (QPoint)(uVar2 | uVar6);
    widget = findDnDTarget((QWidget *)(this->m_widget).wp.value,&local_98);
  }
  if (widget == (QWidget *)0x0) {
    event[0xc] = (QDragMoveEvent)0x0;
  }
  else {
    pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&widget->super_QObject);
    pDVar1 = (this->m_dragTarget).wp.d;
    (this->m_dragTarget).wp.d = pDVar3;
    (this->m_dragTarget).wp.value = &widget->super_QObject;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
    local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    auVar13._0_8_ =
         (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
         *(double *)(event + 0x10);
    auVar13._8_8_ =
         (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
         *(double *)(event + 0x18);
    auVar11 = minpd(_DAT_0066f5d0,auVar13);
    auVar14._8_8_ = -(ulong)(-2147483648.0 < auVar11._8_8_);
    auVar14._0_8_ = -(ulong)(-2147483648.0 < auVar11._0_8_);
    uVar4 = movmskpd(in_ECX,auVar14);
    uVar2 = 0x8000000000000000;
    if ((uVar4 & 2) != 0) {
      uVar2 = (ulong)(uint)(int)auVar11._8_8_ << 0x20;
    }
    uVar6 = 0x80000000;
    if ((uVar4 & 1) != 0) {
      uVar6 = (ulong)(uint)(int)auVar11._0_8_;
    }
    local_48 = (QPoint)(uVar6 | uVar2);
    local_98 = QWidget::mapToGlobal((QWidget *)(this->m_widget).wp.value,&local_48);
    local_40 = QWidget::mapFromGlobal(widget,&local_98);
    puVar7 = &DAT_00675620;
    pQVar8 = &local_98;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      *pQVar8 = (QPoint)*puVar7;
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
      pQVar8 = pQVar8 + (ulong)bVar10 * -2 + 1;
    }
    QDragEnterEvent::QDragEnterEvent
              ((QDragEnterEvent *)&local_98,&local_40,*(undefined4 *)(event + 0x28),
               *(undefined8 *)(event + 0x38),*(undefined4 *)(event + 0x20),
               *(undefined4 *)(event + 0x24));
    pDVar1 = (this->m_dragTarget).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar9 = (QObject *)0x0;
    }
    else {
      pQVar9 = (this->m_dragTarget).wp.value;
    }
    QCoreApplication::forwardEvent(pQVar9,(QEvent *)&local_98,(QEvent *)event);
    (**(code **)(*(long *)event + 0x10))(event,local_8c);
    QDropEvent::setDropAction((DropAction)event);
    QDragEnterEvent::~QDragEnterEvent((QDragEnterEvent *)&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::handleDragEnterEvent(QDragMoveEvent *event, QWidget *widget)
{
    Q_ASSERT(m_dragTarget == nullptr);
    if (!widget)
        widget = findDnDTarget(m_widget, event->position().toPoint());
    if (!widget) {
        event->ignore();
        return;
    }
    m_dragTarget = widget;

    const QPoint mapped = widget->mapFromGlobal(m_widget->mapToGlobal(event->position().toPoint()));
    QDragEnterEvent translated(mapped, event->possibleActions(), event->mimeData(),
                               event->buttons(), event->modifiers());
    QGuiApplication::forwardEvent(m_dragTarget, &translated, event);
    event->setAccepted(translated.isAccepted());
    event->setDropAction(translated.dropAction());
}